

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderControlStatementTests.cpp
# Opt level: O1

int __thiscall deqp::gles2::Performance::LoopCase::init(LoopCase *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  PerfCaseType PVar2;
  DecisionType DVar3;
  pointer pfVar4;
  int iVar5;
  size_t sVar6;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  AttribSpec *__args;
  ostringstream *poVar11;
  long lVar12;
  ostringstream *stream;
  char *__s;
  float fVar13;
  ostringstream vtx;
  ostringstream frag;
  AttribSpec local_3c8;
  Vec4 local_368;
  Vec4 local_358;
  Vec4 local_340;
  Vec4 local_330;
  undefined1 local_320 [376];
  undefined1 local_1a8 [376];
  
  PVar2 = (this->super_ControlStatementCase).super_ShaderPerformanceCase.m_caseType;
  DVar3 = this->m_decisionType;
  pcVar8 = "u_bound";
  if (DVar3 == DECISION_STATIC) {
    pcVar8 = "10.5";
  }
  pcVar9 = "loopBound";
  if ((this->m_isLoopBoundStable & 1U) != 0) {
    pcVar9 = "v_bound";
  }
  __s = "a_bound";
  if (PVar2 != CASETYPE_VERTEX) {
    __s = pcVar9;
  }
  if (DVar3 < DECISION_ATTRIBUTE) {
    __s = pcVar8;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  stream = (ostringstream *)local_1a8;
  if (PVar2 == CASETYPE_VERTEX) {
    stream = (ostringstream *)local_320;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"attribute highp vec4 a_position;\n",0x21);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"attribute mediump vec4 a_value;\n",0x20);
  if (DVar3 - DECISION_UNIFORM < 2) {
    pcVar8 = "uniform mediump float u_bound;\n";
    poVar11 = stream;
    if (DVar3 == DECISION_ATTRIBUTE) {
      pcVar8 = "attribute mediump float a_bound;\n";
      poVar11 = (ostringstream *)local_320;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar11,pcVar8,(ulong)(DVar3 == DECISION_ATTRIBUTE) * 2 + 0x1f);
  }
  if (PVar2 == CASETYPE_VERTEX) {
    lVar12 = 0x1e;
    pcVar8 = "varying mediump vec4 v_color;\n";
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"varying mediump vec4 v_color;\n",0x1e);
LAB_010027ab:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,lVar12);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"varying mediump vec4 v_value;\n",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"varying mediump vec4 v_value;\n",0x1e);
    if (DVar3 == DECISION_ATTRIBUTE) {
      lVar12 = 0x1f;
      pcVar8 = "varying mediump float v_bound;\n";
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"varying mediump float v_bound;\n",0x1f);
      goto LAB_010027ab;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"\tgl_Position = a_position;\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)stream,"\tmediump vec4 res = vec4(0.0);\n",0x1f);
  if (PVar2 != CASETYPE_VERTEX && this->m_isLoopBoundStable == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)stream,"\tmediump float loopBound = fract(v_bound) < 0.5 ? ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"5.5",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream," : ",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"15.5",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,";\n",2);
  }
  if (this->m_type == LOOP_FOR) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)stream,"\tfor (mediump float i = 0.0; i < ",0x21);
    sVar6 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,__s,sVar6);
    lVar12 = 7;
    pcVar8 = "; i++)\n";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)stream,"\tmediump float i = 0.0;\n",0x18);
    if (this->m_type == LOOP_WHILE) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"\twhile (i < ",0xc);
      sVar6 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,__s,sVar6);
      lVar12 = 2;
      pcVar8 = ")\n";
    }
    else {
      lVar12 = 4;
      pcVar8 = "\tdo\n";
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,pcVar8,lVar12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"\t{\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"\t\t",2);
  pcVar8 = "v_value";
  if (PVar2 == CASETYPE_VERTEX) {
    pcVar8 = "a_value";
  }
  writeLoopWorkload((ostringstream *)stream,"res",pcVar8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"\n",1);
  if (this->m_type != LOOP_FOR) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"\t\ti++;\n",7);
  }
  if (this->m_type == LOOP_DO_WHILE) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"\t} while (i < ",0xe);
    sVar6 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,__s,sVar6);
    pcVar8 = ");\n";
  }
  else {
    pcVar8 = "\t}\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,pcVar8,3);
  if (PVar2 == CASETYPE_VERTEX) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"\tv_color = res;\n",0x10);
    lVar12 = 0x19;
    pcVar8 = "\tgl_FragColor = v_color;\n";
  }
  else {
    if (DVar3 == DECISION_ATTRIBUTE) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"\tv_bound = a_bound;\n",0x14);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"\tv_value = a_value;\n",0x14);
    lVar12 = 0x15;
    pcVar8 = "\tgl_FragColor = res;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,lVar12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)
             &(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_vertShaderSource,
             (string *)&local_3c8);
  paVar1 = &local_3c8.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_3c8.name._M_dataplus._M_p,local_3c8.name.field_2._M_allocated_capacity + 1
                   );
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)
             &(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_fragShaderSource,
             (string *)&local_3c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_3c8.name._M_dataplus._M_p,local_3c8.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (DVar3 == DECISION_ATTRIBUTE) {
    if (this->m_isLoopBoundStable == true) {
      local_358.m_data[0] = 10.5;
      local_358.m_data[1] = 0.0;
      local_358.m_data[2] = 0.0;
      local_358.m_data[3] = 0.0;
      local_330.m_data[0] = 10.5;
      local_330.m_data[1] = 0.0;
      local_330.m_data[2] = 0.0;
      local_330.m_data[3] = 0.0;
      local_368.m_data[0] = 10.5;
      local_368.m_data[1] = 0.0;
      local_368.m_data[2] = 0.0;
      local_368.m_data[3] = 0.0;
      local_340.m_data[0] = 10.5;
      local_340.m_data[1] = 0.0;
      local_340.m_data[2] = 0.0;
      local_340.m_data[3] = 0.0;
      deqp::gls::AttribSpec::AttribSpec
                (&local_3c8,"a_bound",&local_358,&local_330,&local_368,&local_340);
      std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::
      emplace_back<deqp::gls::AttribSpec>
                (&(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_attributes,
                 &local_3c8);
    }
    else {
      if (PVar2 == CASETYPE_VERTEX) {
        std::vector<float,_std::allocator<float>_>::resize
                  (&this->m_boundArray,
                   (long)(((this->super_ControlStatementCase).super_ShaderPerformanceCase.m_measurer
                           .m_gridSizeX * 4 + 4) *
                         ((this->super_ControlStatementCase).super_ShaderPerformanceCase.m_measurer.
                          m_gridSizeY + 1)));
        pfVar4 = (this->m_boundArray).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = (uint)((ulong)((long)(this->m_boundArray).
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)pfVar4) >> 2);
        if (0 < (int)uVar7) {
          uVar10 = 0;
          do {
            fVar13 = 0.0;
            if ((uVar10 & 3) == 0) {
              fVar13 = *(float *)(&DAT_01c1b4cc + (ulong)((uVar10 & 4) == 0) * 4);
            }
            pfVar4[uVar10] = fVar13;
            uVar10 = uVar10 + 1;
          } while ((uVar7 & 0x7fffffff) != uVar10);
        }
        goto LAB_01002c8f;
      }
      local_340.m_data[0] =
           (float)(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_measurer.
                  m_viewportWidth * 0.5;
      local_358.m_data[0] = 0.0;
      local_358.m_data[1] = 0.0;
      local_358.m_data[2] = 0.0;
      local_358.m_data[3] = 0.0;
      local_330.m_data[1] = 0.0;
      local_330.m_data[2] = 0.0;
      local_330.m_data[3] = 0.0;
      local_368.m_data[0] = 0.0;
      local_368.m_data[1] = 0.0;
      local_368.m_data[2] = 0.0;
      local_368.m_data[3] = 0.0;
      local_340.m_data[1] = 0.0;
      local_340.m_data[2] = 0.0;
      local_340.m_data[3] = 0.0;
      local_330.m_data[0] = local_340.m_data[0];
      deqp::gls::AttribSpec::AttribSpec
                (&local_3c8,"a_bound",&local_358,&local_330,&local_368,&local_340);
      std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::
      emplace_back<deqp::gls::AttribSpec>
                (&(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_attributes,
                 &local_3c8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_3c8.name._M_dataplus._M_p,
                      local_3c8.name.field_2._M_allocated_capacity + 1);
    }
  }
LAB_01002c8f:
  local_358.m_data[0] = 0.0;
  local_358.m_data[1] = 0.1;
  local_358.m_data[2] = 0.2;
  local_358.m_data[3] = 0.3;
  local_330.m_data[0] = 0.4;
  local_330.m_data[1] = 0.5;
  local_330.m_data[2] = 0.6;
  local_330.m_data[3] = 0.7;
  local_368.m_data[0] = 0.8;
  local_368.m_data[1] = 0.9;
  local_368.m_data[2] = 1.0;
  local_368.m_data[3] = 1.1;
  local_340.m_data[0] = 1.2;
  local_340.m_data[1] = 1.3;
  local_340.m_data[2] = 1.4;
  local_340.m_data[3] = 1.5;
  deqp::gls::AttribSpec::AttribSpec
            (&local_3c8,"a_value",&local_358,&local_330,&local_368,&local_340);
  __args = &local_3c8;
  std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::
  emplace_back<deqp::gls::AttribSpec>
            (&(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_attributes,__args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8.name._M_dataplus._M_p != paVar1) {
    __args = (AttribSpec *)(local_3c8.name.field_2._M_allocated_capacity + 1);
    operator_delete(local_3c8.name._M_dataplus._M_p,(ulong)__args);
  }
  ControlStatementCase::init(&this->super_ControlStatementCase,(EVP_PKEY_CTX *)__args);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  iVar5 = std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
  return iVar5;
}

Assistant:

void LoopCase::init (void)
{
	bool				isVertexCase	= m_caseType == CASETYPE_VERTEX;

	bool				isStaticCase	= m_decisionType == DECISION_STATIC;
	bool				isUniformCase	= m_decisionType == DECISION_UNIFORM;
	bool				isAttributeCase	= m_decisionType == DECISION_ATTRIBUTE;

	DE_ASSERT(isStaticCase || isUniformCase || isAttributeCase);

	DE_ASSERT(m_type == LOOP_FOR		||
			  m_type == LOOP_WHILE		||
			  m_type == LOOP_DO_WHILE);

	DE_ASSERT(isAttributeCase || m_isLoopBoundStable); // The loop bound count can vary between executions only if using attribute input.

	// \note The fractional part is .5 (instead of .0) so that these can be safely used as loop bounds.
	const float			loopBound				= 10.5f;
	const float			unstableBoundLow		= 5.5f;
	const float			unstableBoundHigh		= 15.5f;
	static const char*	loopBoundStr			= "10.5";
	static const char*	unstableBoundLowStr		= "5.5";
	static const char*	unstableBoundHighStr	= "15.5";

	const char*			boundValueStr		= isStaticCase			? loopBoundStr :
											  isUniformCase			? "u_bound" :
											  isVertexCase			? "a_bound" :
											  m_isLoopBoundStable	? "v_bound" :
																	  "loopBound";

	std::ostringstream	vtx;
	std::ostringstream	frag;
	std::ostringstream&	op		= isVertexCase ? vtx : frag;

	vtx << "attribute highp vec4 a_position;\n";	// Position attribute.
	vtx << "attribute mediump vec4 a_value;\n";		// Input for workload calculations.

	// Value to be used as the loop iteration count.
	if (isAttributeCase)
		vtx << "attribute mediump float a_bound;\n";
	else if (isUniformCase)
		op << "uniform mediump float u_bound;\n";

	// Varyings.
	if (isVertexCase)
	{
		vtx << "varying mediump vec4 v_color;\n";
		frag << "varying mediump vec4 v_color;\n";
	}
	else
	{
		vtx << "varying mediump vec4 v_value;\n";
		frag << "varying mediump vec4 v_value;\n";

		if (isAttributeCase)
		{
			vtx << "varying mediump float v_bound;\n";
			frag << "varying mediump float v_bound;\n";
		}
	}

	vtx << "\n";
	vtx << "void main()\n";
	vtx << "{\n";
	vtx << "	gl_Position = a_position;\n";

	frag << "\n";
	frag << "void main()\n";
	frag << "{\n";

	op << "	mediump vec4 res = vec4(0.0);\n";

	if (!m_isLoopBoundStable && !isVertexCase)
	{
		// Choose the actual loop bound based on v_bound.
		// \note Loop bound will vary with high frequency between fragment columns, given appropriate range for v_bound.
		op << "	mediump float loopBound = fract(v_bound) < 0.5 ? " << unstableBoundLowStr << " : " << unstableBoundHighStr << ";\n";
	}

	// Start a for, while or do-while loop.
	if (m_type == LOOP_FOR)
		op << "	for (mediump float i = 0.0; i < " << boundValueStr << "; i++)\n";
	else
	{
		op << "	mediump float i = 0.0;\n";
		if (m_type == LOOP_WHILE)
			op << "	while (i < " << boundValueStr << ")\n";
		else // LOOP_DO_WHILE
			op << "	do\n";
	}
	op << "	{\n";

	// Workload calculations inside the loop.
	op << "\t\t";
	writeLoopWorkload(op, "res", isVertexCase ? "a_value" : "v_value");
	op << "\n";

	// Only "for" has counter increment in the loop head.
	if (m_type != LOOP_FOR)
		op << "		i++;\n";

	// End the loop.
	if (m_type == LOOP_DO_WHILE)
		op << "	} while (i < " << boundValueStr << ");\n";
	else
		op << "	}\n";

	if (isVertexCase)
	{
		// Put result to color variable.
		vtx << "	v_color = res;\n";
		frag << "	gl_FragColor = v_color;\n";
	}
	else
	{
		// Transfer inputs to fragment shader through varyings.
		if (isAttributeCase)
			vtx << "	v_bound = a_bound;\n";
		vtx << "	v_value = a_value;\n";

		frag << "	gl_FragColor = res;\n"; // Put result to color variable.
	}

	vtx << "}\n";
	frag << "}\n";

	m_vertShaderSource = vtx.str();
	m_fragShaderSource = frag.str();

	if (isAttributeCase)
	{
		if (m_isLoopBoundStable)
		{
			// Every execution has same number of iterations.

			m_attributes.push_back(AttribSpec("a_bound",	Vec4(loopBound, 0.0f, 0.0f, 0.0f),
															Vec4(loopBound, 0.0f, 0.0f, 0.0f),
															Vec4(loopBound, 0.0f, 0.0f, 0.0f),
															Vec4(loopBound, 0.0f, 0.0f, 0.0f)));
		}
		else if (isVertexCase)
		{
			// Vertex case, with non-constant number of iterations.

			const int	numComponents	= 4;
			int			numVertices		= (getGridWidth() + 1) * (getGridHeight() + 1);

			// setupProgram() will later bind this array as an attribute.
			m_boundArray.resize(numVertices * numComponents);

			// Vary between low and high loop bounds; they should average to loopBound however.
			for (int i = 0; i < (int)m_boundArray.size(); i++)
			{
				if (i % numComponents == 0)
					m_boundArray[i] = (i / numComponents) % 2 == 0 ? unstableBoundLow : unstableBoundHigh;
				else
					m_boundArray[i] = 0.0f;
			}
		}
		else // !m_isLoopBoundStable && !isVertexCase
		{
			// Fragment case, with non-constant number of iterations.
			// \note fract(a_bound) < 0.5 will be true for every second fragment.

			float minValue = 0.0f;
			float maxValue = (float)getViewportWidth()*0.5f;
			m_attributes.push_back(AttribSpec("a_bound",	Vec4(minValue, 0.0f, 0.0f, 0.0f),
															Vec4(maxValue, 0.0f, 0.0f, 0.0f),
															Vec4(minValue, 0.0f, 0.0f, 0.0f),
															Vec4(maxValue, 0.0f, 0.0f, 0.0f)));
		}
	}

	m_attributes.push_back(AttribSpec("a_value",	Vec4(0.0f, 0.1f, 0.2f, 0.3f),
													Vec4(0.4f, 0.5f, 0.6f, 0.7f),
													Vec4(0.8f, 0.9f, 1.0f, 1.1f),
													Vec4(1.2f, 1.3f, 1.4f, 1.5f)));

	ControlStatementCase::init();
}